

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

int Cmd_RunAutoTunerEval(Vec_Ptr_t *vAigs,satoko_opts_t *pOpts,int nProcs)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Vec_Ptr_t *p;
  void **__dest;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Cmd_AutoData_t *__arg;
  pthread_t *__newthread;
  ulong uVar8;
  Cmd_AutoData_t ThData [100];
  pthread_t WorkerThread [100];
  
  if (nProcs == 1) {
    iVar3 = Cmd_RunAutoTunerEvalSimple(vAigs,pOpts);
    return iVar3;
  }
  if (nProcs - 2U < 100) {
    uVar4 = nProcs - 1;
    __newthread = WorkerThread;
    __arg = ThData;
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        p = (Vec_Ptr_t *)malloc(0x10);
        uVar1 = vAigs->nSize;
        uVar8 = (ulong)uVar1;
        iVar3 = vAigs->nCap;
        uVar5 = 0;
        p->nCap = iVar3;
        if ((long)iVar3 == 0) {
          __dest = (void **)0x0;
        }
        else {
          __dest = (void **)malloc((long)iVar3 << 3);
        }
        p->pArray = __dest;
        memcpy(__dest,vAigs->pArray,(long)(int)uVar1 << 3);
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar6 = uVar5;
        }
        bVar2 = true;
        do {
          if (!bVar2) {
            p->nSize = (int)uVar8;
            Vec_PtrFree(p);
            lVar7 = 0;
            while( true ) {
              if (uVar6 << 5 == lVar7) {
                return (int)uVar5;
              }
              if (*(int *)((long)&ThData[0].fWorking + lVar7) != 0) break;
              *(undefined8 *)((long)&ThData[0].pGia + lVar7) = 0;
              *(undefined4 *)((long)&ThData[0].fWorking + lVar7) = 1;
              lVar7 = lVar7 + 0x20;
            }
            __assert_fail("!ThData[i].fWorking",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                          ,0xcd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
          }
          bVar2 = 0 < (int)uVar8;
          for (lVar7 = 0; uVar6 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
            if (*(int *)((long)&ThData[0].fWorking + lVar7) == 0) {
              if (*(long *)((long)&ThData[0].pGia + lVar7) != 0) {
                iVar3 = *(int *)((long)&ThData[0].Result + lVar7);
                if (iVar3 < 0) {
                  __assert_fail("ThData[i].Result >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                                ,0xbd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)")
                  ;
                }
                uVar5 = (ulong)(uint)((int)uVar5 + iVar3);
                *(undefined8 *)((long)&ThData[0].pGia + lVar7) = 0;
              }
              iVar3 = (int)uVar8;
              if (iVar3 == 0) {
                uVar8 = 0;
              }
              else {
                if (iVar3 < 1) {
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
                }
                uVar8 = (ulong)(iVar3 - 1);
                *(void **)((long)&ThData[0].pGia + lVar7) = __dest[uVar8];
                *(undefined4 *)((long)&ThData[0].fWorking + lVar7) = 1;
              }
            }
            else {
              bVar2 = true;
            }
          }
        } while( true );
      }
      __arg->pGia = (Gia_Man_t *)0x0;
      __arg->pOpts = pOpts;
      __arg->iThread = (int)uVar5;
      __arg->nTimeOut = -1;
      __arg->fWorking = 0;
      __arg->Result = -1;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,Cmd_RunAutoTunerEvalWorkerThread,
                             __arg);
      uVar5 = uVar5 + 1;
      __newthread = __newthread + 1;
      __arg = __arg + 1;
    } while (iVar3 == 0);
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                  ,0xab,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
  }
  __assert_fail("nProcs >= 1 && nProcs <= CMD_THR_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                ,0xa1,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
}

Assistant:

int Cmd_RunAutoTunerEval( Vec_Ptr_t * vAigs, satoko_opts_t * pOpts, int nProcs )
{
    Cmd_AutoData_t ThData[CMD_THR_MAX];
    pthread_t WorkerThread[CMD_THR_MAX];
    int i, status, fWorkToDo = 1, TotalCost = 0;
    Vec_Ptr_t * vStack;
    if ( nProcs == 1 )
        return Cmd_RunAutoTunerEvalSimple( vAigs, pOpts );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= CMD_THR_MAX );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].pGia     = NULL;
        ThData[i].pOpts    = pOpts;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = -1;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cmd_RunAutoTunerEvalWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    vStack = Vec_PtrDup(vAigs);
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].pGia != NULL )
            {
                assert( ThData[i].Result >= 0 );
                TotalCost += ThData[i].Result;
                ThData[i].pGia = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // give this thread a new job
            assert( ThData[i].pGia == NULL );
            ThData[i].pGia = (Gia_Man_t *)Vec_PtrPop( vStack );
            ThData[i].fWorking = 1;
        }
    }
    Vec_PtrFree( vStack );
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // stop
        ThData[i].pGia = NULL;
        ThData[i].fWorking = 1;
    }
    return TotalCost;
}